

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Write.cpp
# Opt level: O2

error<idx2::idx2_err_code> idx2::FlushChunks(idx2_file *Idx2,encode_data *E)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  byte *pbVar8;
  t2<unsigned_int,_idx2::channel_*> *Beg;
  ulong *puVar9;
  double dVar10;
  long lVar11;
  u64 uVar12;
  anon_union_8_2_2df48d06_for_stref_0 *paVar13;
  long lVar14;
  uint *puVar15;
  size_t sVar16;
  long lVar17;
  str pcVar18;
  long lVar19;
  uint *puVar20;
  long *in_FS_OFFSET;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined8 uVar24;
  undefined1 in_ZMM2 [64];
  undefined8 in_XMM3_Qb;
  stref sVar25;
  FILE *Fp;
  u64 *local_a8;
  anon_union_8_2_2df48d06_for_stref_0 *local_a0;
  long *local_98;
  long local_90;
  array<idx2::t2<unsigned_int,_idx2::channel_*>_> *local_88;
  anon_union_8_2_2df48d06_for_stref_0 local_80;
  long lStack_78;
  anon_union_8_2_2df48d06_for_stref_0 local_70;
  file_id FileId;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Write_cpp:369:5)>
  __ScopeGuard__369;
  anon_union_8_2_2df48d06_for_stref_0 local_40;
  undefined4 local_38;
  
  local_88 = &E->SortedChannels;
  GrowCapacity<idx2::t2<unsigned_int,idx2::channel*>>(local_88,(E->Channels).Size);
  (E->SortedChannels).Size = 0;
  Begin<unsigned_int,idx2::channel>(&E->Channels);
  while ((paVar13 = local_a0, (hash_table<unsigned_int,_idx2::channel> *)local_98 != &E->Channels ||
         (local_90 != 1L << ((byte)(E->Channels).LogCapacity & 0x3f)))) {
    uVar12 = *local_a8;
    lVar19 = (E->SortedChannels).Size;
    if ((E->SortedChannels).Capacity <= lVar19) {
      GrowCapacity<idx2::t2<unsigned_int,idx2::channel*>>(local_88,0);
      lVar19 = (E->SortedChannels).Size;
    }
    (E->SortedChannels).Size = lVar19 + 1;
    pbVar8 = (E->SortedChannels).Buffer.Data;
    *(int *)(pbVar8 + lVar19 * 0x10) = (int)uVar12;
    *(anon_union_8_2_2df48d06_for_stref_0 **)(pbVar8 + lVar19 * 0x10 + 8) = paVar13;
    lVar19 = local_90 * 4;
    lVar14 = local_90 * 0xd8;
    do {
      lVar17 = lVar14;
      lVar19 = lVar19 + 4;
      lVar11 = local_90 + 1;
      local_90 = local_90 + 1;
      lVar14 = lVar17 + 0xd8;
    } while (*(char *)(local_98[2] + lVar11) != '\x02');
    local_a8 = (u64 *)(lVar19 + *local_98);
    local_a0 = (anon_union_8_2_2df48d06_for_stref_0 *)(local_98[1] + 0xd8 + lVar17);
  }
  Beg = (t2<unsigned_int,_idx2::channel_*> *)(E->SortedChannels).Buffer.Data;
  InsertionSort<idx2::t2<unsigned_int,idx2::channel*>*>(Beg,Beg + (E->SortedChannels).Size);
  puVar15 = (uint *)(E->SortedChannels).Buffer.Data;
  for (puVar20 = puVar15; puVar20 != puVar15 + (E->SortedChannels).Size * 4; puVar20 = puVar20 + 4)
  {
    uVar7 = *puVar20;
    WriteChunk(Idx2,E,*(channel **)(puVar20 + 2),(byte)uVar7 & 0xf,(i8)(uVar7 >> 4),
               (i16)(uVar7 >> 0x10));
    puVar15 = (uint *)(E->SortedChannels).Buffer.Data;
  }
  Begin<unsigned_long,idx2::chunk_meta_info>(&E->ChunkMeta);
  local_88 = (array<idx2::t2<unsigned_int,_idx2::channel_*>_> *)&E->CompressedChunkAddresses;
  while( true ) {
    paVar13 = local_a0;
    uVar24 = in_ZMM2._8_8_;
    if (((hash_table<unsigned_long,_idx2::chunk_meta_info> *)local_98 == &E->ChunkMeta) &&
       (local_90 == 1L << ((byte)(E->ChunkMeta).LogCapacity & 0x3f))) break;
    ConstructFilePath(&FileId,Idx2,*local_a8);
    if (FileId.Id != *local_a8) {
      ConstructFilePath((file_id *)&local_80,Idx2,*local_a8);
      FileId.Id = (u64)local_70;
      FileId.Name.field_0 = local_80;
      FileId.Name._8_8_ = lStack_78;
    }
    Fp = (FILE *)fopen(FileId.Name.field_0.Ptr,"ab");
    __ScopeGuard__369.Func.Fp = &Fp;
    __ScopeGuard__369.Dismissed = false;
    if ((FILE *)Fp == (FILE *)0x0) {
      local_40 = FileId.Name.field_0;
      sVar16 = strlen(FileId.Name.field_0.Ptr);
      local_38 = (undefined4)sVar16;
      sVar25 = GetParentPath((stref *)&local_40);
      local_80 = sVar25.field_0;
      lStack_78 = CONCAT44(lStack_78._4_4_,sVar25.Size);
      CreateFullDir((stref *)&local_80);
      Fp = (FILE *)fopen(FileId.Name.field_0.Ptr,"ab");
    }
    puVar9 = (ulong *)paVar13[9].Ptr;
    pcVar18 = paVar13[10].Ptr;
    *puVar9 = (ulong)pcVar18;
    uVar7 = *(uint *)(paVar13 + 0xb);
    if (0 < (int)uVar7 >> 3) {
      paVar13[10].Ptr = (str)(((ulong)pcVar18 >> 1) >> (((byte)uVar7 & 0xf8) - 1 & 0x3f));
    }
    pcVar18 = (str)((long)puVar9 + (long)((int)uVar7 >> 3));
    paVar13[9].Ptr = pcVar18;
    *(uint *)(paVar13 + 0xb) = uVar7 & 7;
    fwrite(paVar13[6].Ptr,(size_t)(pcVar18 + ((ulong)((uVar7 & 7) != 0) - (long)paVar13[6].Ptr)),1,
           (FILE *)Fp);
    auVar21._0_8_ =
         (double)(long)(paVar13[9].Ptr +
                       ((long)((*(int *)(paVar13 + 0xb) + 7) / 8) - (long)paVar13[6].Ptr));
    auVar21._8_8_ = in_XMM3_Qb;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = _ZN4idx2L14ChunkSizesStatE_0;
    auVar1 = vminsd_avx(auVar21,auVar1);
    _ZN4idx2L14ChunkSizesStatE_0 = auVar1._0_8_;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = _ZN4idx2L14ChunkSizesStatE_1;
    auVar1 = vmaxsd_avx(auVar21,auVar2);
    _ZN4idx2L14ChunkSizesStatE_1 = auVar1._0_8_;
    _ZN4idx2L14ChunkSizesStatE_2 = auVar21._0_8_ + _ZN4idx2L14ChunkSizesStatE_2;
    _ZN4idx2L14ChunkSizesStatE_3 = _ZN4idx2L14ChunkSizesStatE_3 + 1;
    _ZN4idx2L14ChunkSizesStatE_4 = auVar21._0_8_ * auVar21._0_8_ + _ZN4idx2L14ChunkSizesStatE_4;
    WritePOD<int>(Fp,(int)(paVar13[9].Ptr +
                          ((long)((*(int *)(paVar13 + 0xb) + 7) / 8) - (long)paVar13[6].Ptr)));
    lStack_78 = (long)paVar13[3].Ptr << 3;
    local_80 = *paVar13;
    local_70 = paVar13[2];
    CompressBufZstd((buffer *)&local_80,(bitstream *)local_88);
    pbVar8 = (E->CompressedChunkAddresses).Stream.Data;
    fwrite(pbVar8,(size_t)((E->CompressedChunkAddresses).BitPtr +
                          ((long)(((E->CompressedChunkAddresses).BitPos + 7) / 8) - (long)pbVar8)),1
           ,(FILE *)Fp);
    WritePOD<int>(Fp,(*(int *)&(E->CompressedChunkAddresses).BitPtr -
                     *(int *)&(E->CompressedChunkAddresses).Stream.Data) +
                     ((E->CompressedChunkAddresses).BitPos + 7) / 8);
    WritePOD<int>(Fp,*(int *)(paVar13 + 3));
    dVar10 = (double)(long)paVar13[3].Ptr * 8.0;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = _ZN4idx2L30UncompressedChunkAddressesStatE_0;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = dVar10;
    auVar1 = vminsd_avx(auVar22,auVar3);
    _ZN4idx2L30UncompressedChunkAddressesStatE_0 = auVar1._0_8_;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = _ZN4idx2L30UncompressedChunkAddressesStatE_1;
    auVar1 = vmaxsd_avx(auVar22,auVar4);
    _ZN4idx2L30UncompressedChunkAddressesStatE_1 = auVar1._0_8_;
    _ZN4idx2L30UncompressedChunkAddressesStatE_2 =
         dVar10 + _ZN4idx2L30UncompressedChunkAddressesStatE_2;
    _ZN4idx2L30UncompressedChunkAddressesStatE_3 = _ZN4idx2L30UncompressedChunkAddressesStatE_3 + 1;
    _ZN4idx2L30UncompressedChunkAddressesStatE_4 =
         dVar10 * dVar10 + _ZN4idx2L30UncompressedChunkAddressesStatE_4;
    auVar23._0_8_ =
         (double)(long)((E->CompressedChunkAddresses).BitPtr +
                       ((long)(((E->CompressedChunkAddresses).BitPos + 7) / 8) -
                       (long)(E->CompressedChunkAddresses).Stream.Data));
    auVar23._8_8_ = uVar24;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = _ZN4idx2L28CompressedChunkAddressesStatE_0;
    auVar2 = vminsd_avx(auVar23,auVar5);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = _ZN4idx2L28CompressedChunkAddressesStatE_1;
    auVar1 = vmaxsd_avx(auVar23,auVar6);
    in_ZMM2 = ZEXT1664(auVar1);
    _ZN4idx2L28CompressedChunkAddressesStatE_0 = auVar2._0_8_;
    _ZN4idx2L28CompressedChunkAddressesStatE_1 = auVar1._0_8_;
    _ZN4idx2L28CompressedChunkAddressesStatE_2 =
         auVar23._0_8_ + _ZN4idx2L28CompressedChunkAddressesStatE_2;
    _ZN4idx2L28CompressedChunkAddressesStatE_3 = _ZN4idx2L28CompressedChunkAddressesStatE_3 + 1;
    _ZN4idx2L28CompressedChunkAddressesStatE_4 =
         auVar23._0_8_ * auVar23._0_8_ + _ZN4idx2L28CompressedChunkAddressesStatE_4;
    scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Write.cpp:369:5)>
    ::~scope_guard(&__ScopeGuard__369);
    lVar19 = local_90 * 8;
    lVar14 = local_90 * 0x60;
    do {
      lVar17 = lVar14;
      lVar19 = lVar19 + 8;
      lVar11 = local_90 + 1;
      local_90 = local_90 + 1;
      lVar14 = lVar17 + 0x60;
    } while (*(char *)(local_98[2] + lVar11) != '\x02');
    local_a8 = (u64 *)(lVar19 + *local_98);
    local_a0 = (anon_union_8_2_2df48d06_for_stref_0 *)(local_98[1] + 0x60 + lVar17);
  }
  *(char **)(*in_FS_OFFSET + -0xb80) =
       "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Write.cpp"
  ;
  *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x180;
  return (error<idx2::idx2_err_code>)ZEXT816(0x19942d);
}

Assistant:

error<idx2_err_code>
FlushChunks(const idx2_file& Idx2, encode_data* E)
{
#if VISUS_IDX2
  if (Idx2.external_write)
  {
    Reserve(&E->SortedChannels, Size(E->Channels));
    Clear(&E->SortedChannels);
    idx2_ForEach (Ch, E->Channels)
    {
      PushBack(&E->SortedChannels, t2<u32, channel*>{ *Ch.Key, Ch.Val });
    }
    InsertionSort(Begin(E->SortedChannels), End(E->SortedChannels));
    idx2_ForEach (Ch, E->SortedChannels)
    {
      i8 Level = GetLevelFromChannelKey(Ch->First);
      i8 Subband = GetSubbandFromChannelKey(Ch->First);
      i16 BitPlane = BitPlaneFromChannelKey(Ch->First);
      // printf("key %llu level %d subband %d bitplane %d\n", Ch->First, Level, Subband, BitPlane);
      WriteChunk(Idx2, E, Ch->Second, Level, Subband, BitPlane); //just call WriteChunk
    }
    return idx2_Error(idx2_err_code::NoError);
  }
#endif
  /* write the chunks */
  Reserve(&E->SortedChannels, Size(E->Channels));
  Clear(&E->SortedChannels);
  idx2_ForEach (Ch, E->Channels)
  {
    PushBack(&E->SortedChannels, t2<u32, channel*>{ *Ch.Key, Ch.Val });
  }
  InsertionSort(Begin(E->SortedChannels), End(E->SortedChannels));
  idx2_ForEach (Ch, E->SortedChannels)
  {
    i8 Level = GetLevelFromChannelKey(Ch->First);
    i8 Subband = GetSubbandFromChannelKey(Ch->First);
    i16 BitPlane = BitPlaneFromChannelKey(Ch->First);
    //printf("key %llu level %d subband %d bitplane %d\n", Ch->First, Level, Subband, BitPlane);
    WriteChunk(Idx2, E, Ch->Second, Level, Subband, BitPlane);
  }

  /* write the chunk metadata */
  idx2_ForEach (CmIt, E->ChunkMeta)
  {
    chunk_meta_info* Cm = CmIt.Val;
    file_id FileId = ConstructFilePath(Idx2, *CmIt.Key);
    if (FileId.Id != *CmIt.Key)
    {
      FileId = ConstructFilePath(Idx2, *CmIt.Key);
    }
    //printf("%llu %s\n", FileId.Id, FileId.Name.ConstPtr);
    idx2_Assert(FileId.Id == *CmIt.Key);
    /* compress and write chunk sizes */
    idx2_OpenMaybeExistingFile(Fp, FileId.Name.ConstPtr, "ab");
    Flush(&Cm->Sizes);
    WriteBuffer(Fp, ToBuffer(Cm->Sizes));
    ChunkSizesStat.Add((f64)Size(Cm->Sizes));
    WritePOD(Fp, (int)Size(Cm->Sizes));
    /* compress and write chunk addresses */
    CompressBufZstd(ToBuffer(Cm->Addrs), &E->CompressedChunkAddresses);
    WriteBuffer(Fp, ToBuffer(E->CompressedChunkAddresses));
    // write size of the compressed chunk addresses
    WritePOD(Fp, (int)Size(E->CompressedChunkAddresses));
    WritePOD(Fp, (int)Size(Cm->Addrs)); // number of chunks
    UncompressedChunkAddressesStat.Add((f64)Size(Cm->Addrs) * sizeof(Cm->Addrs[0]));
    CompressedChunkAddressesStat.Add((f64)Size(E->CompressedChunkAddresses));
  }

  return idx2_Error(idx2_err_code::NoError);
}